

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

HelicsEndpoint helicsFederateGetEndpoint(HelicsFederate fed,char *name,HelicsError *err)

{
  bool bVar1;
  element_type *this;
  HelicsError *in_RDX;
  long in_RSI;
  string_view in_stack_00000000;
  Endpoint *in_stack_00000030;
  Endpoint *ept;
  shared_ptr<helics::MessageFederate> fedObj;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  HelicsError *in_stack_ffffffffffffff90;
  HelicsFederate in_stack_ffffffffffffff98;
  __shared_ptr local_30 [16];
  HelicsError *local_20;
  long local_18;
  MessageFederate *in_stack_fffffffffffffff8;
  HelicsEndpoint pvVar2;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  getMessageFedSharedPtr(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
  if (bVar1) {
    if (local_18 == 0) {
      assignError(local_20,-4,"The supplied string argument is null and therefore invalid");
      pvVar2 = (HelicsEndpoint)0x0;
    }
    else {
      this = std::
             __shared_ptr_access<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1ddb47);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      helics::MessageFederate::getEndpoint(in_stack_fffffffffffffff8,in_stack_00000000);
      bVar1 = helics::Interface::isValid((Interface *)0x1ddb8a);
      if (bVar1) {
        pvVar2 = anon_unknown.dwarf_784a3::findOrCreateEndpoint(ept,in_stack_00000030);
      }
      else {
        assignError(local_20,-4,"the specified Endpoint name is not recognized");
        pvVar2 = (HelicsEndpoint)0x0;
      }
    }
  }
  else {
    pvVar2 = (HelicsEndpoint)0x0;
  }
  std::shared_ptr<helics::MessageFederate>::~shared_ptr
            ((shared_ptr<helics::MessageFederate> *)0x1ddc3e);
  return pvVar2;
}

Assistant:

HelicsEndpoint helicsFederateGetEndpoint(HelicsFederate fed, const char* name, HelicsError* err)
{
    auto fedObj = getMessageFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    CHECK_NULL_STRING(name, nullptr);
    try {
        auto& ept = fedObj->getEndpoint(name);
        if (!ept.isValid()) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidEndName);
            return nullptr;
        }
        return findOrCreateEndpoint(fed, ept);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    // LCOV_EXCL_STOP
}